

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O0

void __thiscall asl::TabularDataFile::TabularDataFile(TabularDataFile *this)

{
  EVP_PKEY_CTX *in_RSI;
  TabularDataFile *this_local;
  
  TextFile::TextFile(&this->_file);
  Array<asl::String>::Array(&this->_columnNames);
  Array<asl::Var>::Array(&this->_row);
  asl::String::String(&this->_currentLine);
  Array<asl::String>::Array(&this->_currentRowParts);
  asl::String::String(&this->_name);
  asl::String::String(&this->_types);
  asl::String::String(&this->_equote);
  init(this,in_RSI);
  return;
}

Assistant:

TabularDataFile::TabularDataFile()
{
	init();
}